

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall
kj::_::NetworkFilter::NetworkFilter
          (NetworkFilter *this,ArrayPtr<const_kj::StringPtr> allow,
          ArrayPtr<const_kj::StringPtr> deny,NetworkFilter *next)

{
  undefined8 *puVar1;
  StringPtr pattern;
  StringPtr pattern_00;
  Vector<kj::CidrRange> *this_00;
  StringPtr *pSVar2;
  bool bVar3;
  long lVar4;
  Fault f;
  StringPtr rule;
  CidrRange local_80;
  NetworkFilter *local_68;
  Vector<kj::CidrRange> *local_60;
  ArrayPtr<const_char> local_58;
  Vector<kj::CidrRange> *local_40;
  StringPtr *local_38;
  
  local_38 = deny.ptr;
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00598010;
  local_60 = &this->allowCidrs;
  (this->allowCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->allowCidrs).builder.ptr = (CidrRange *)0x0;
  (this->allowCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->allowCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  (this->denyCidrs).builder.ptr = (CidrRange *)0x0;
  (this->denyCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->denyCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->denyCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this->allowUnix = false;
  this->allowAbstractUnix = false;
  this->allowPublic = false;
  this->allowNetwork = false;
  local_40 = &this->denyCidrs;
  (this->next).ptr = next;
  local_68 = this;
  for (lVar4 = 0; pSVar2 = local_38, this_00 = local_40, allow.size_ << 4 != lVar4;
      lVar4 = lVar4 + 0x10) {
    puVar1 = (undefined8 *)((long)&((allow.ptr)->content).ptr + lVar4);
    local_58.ptr = (char *)*puVar1;
    local_58.size_ = puVar1[1];
    local_80._0_8_ = "local";
    local_80.bits[4] = '\x06';
    local_80.bits[5] = '\0';
    local_80.bits[6] = '\0';
    local_80.bits[7] = '\0';
    local_80.bits[8] = '\0';
    local_80.bits[9] = '\0';
    local_80.bits[10] = '\0';
    local_80.bits[0xb] = '\0';
    bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
    if (bVar3) {
      local_80._0_16_ = localCidrs();
      Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>
                (local_60,(ArrayPtr<const_kj::CidrRange> *)&local_80);
    }
    else {
      local_80.bits._4_8_ = 8;
      local_80._0_8_ = "network";
      bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
      if (bVar3) {
        local_68->allowNetwork = true;
      }
      else {
        local_80._0_8_ = "private";
        local_80.bits[4] = '\b';
        local_80.bits[5] = '\0';
        local_80.bits[6] = '\0';
        local_80.bits[7] = '\0';
        local_80.bits[8] = '\0';
        local_80.bits[9] = '\0';
        local_80.bits[10] = '\0';
        local_80.bits[0xb] = '\0';
        bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
        if (bVar3) {
          local_80._0_16_ = privateCidrs();
          Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>
                    (local_60,(ArrayPtr<const_kj::CidrRange> *)&local_80);
          local_80._0_16_ = localCidrs();
          Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>
                    (local_60,(ArrayPtr<const_kj::CidrRange> *)&local_80);
        }
        else {
          local_80.bits._4_8_ = 7;
          local_80._0_8_ = "public";
          bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
          if (bVar3) {
            local_68->allowPublic = true;
          }
          else {
            local_80.bits._4_8_ = 5;
            local_80._0_8_ = "unix";
            bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
            if (bVar3) {
              local_68->allowUnix = true;
            }
            else {
              local_80.bits._4_8_ = 0xe;
              local_80._0_8_ = "unix-abstract";
              bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
              if (bVar3) {
                local_68->allowAbstractUnix = true;
              }
              else {
                pattern.content.size_ = local_58.size_;
                pattern.content.ptr = local_58.ptr;
                CidrRange::CidrRange(&local_80,pattern);
                Vector<kj::CidrRange>::add<kj::CidrRange>(local_60,&local_80);
              }
            }
          }
        }
      }
    }
  }
  lVar4 = 0;
  do {
    if (deny.size_ << 4 == lVar4) {
      return;
    }
    puVar1 = (undefined8 *)((long)&(pSVar2->content).ptr + lVar4);
    local_58.ptr = (char *)*puVar1;
    local_58.size_ = puVar1[1];
    local_80._0_8_ = "local";
    local_80.bits[4] = '\x06';
    local_80.bits[5] = '\0';
    local_80.bits[6] = '\0';
    local_80.bits[7] = '\0';
    local_80.bits[8] = '\0';
    local_80.bits[9] = '\0';
    local_80.bits[10] = '\0';
    local_80.bits[0xb] = '\0';
    bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
    if (bVar3) {
      local_80._0_16_ = localCidrs();
      Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>
                (this_00,(ArrayPtr<const_kj::CidrRange> *)&local_80);
    }
    else {
      local_80._0_8_ = "network";
      local_80.bits[4] = '\b';
      local_80.bits[5] = '\0';
      local_80.bits[6] = '\0';
      local_80.bits[7] = '\0';
      local_80.bits[8] = '\0';
      local_80.bits[9] = '\0';
      local_80.bits[10] = '\0';
      local_80.bits[0xb] = '\0';
      bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
      if (bVar3) {
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                  ((Fault *)&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0xc28,FAILED,(char *)0x0,"\"don\'t deny \'network\', allow \'local\' instead\"",
                   (char (*) [44])"don\'t deny \'network\', allow \'local\' instead");
        Debug::Fault::fatal((Fault *)&local_80);
      }
      local_80._0_8_ = "private";
      local_80.bits[4] = '\b';
      local_80.bits[5] = '\0';
      local_80.bits[6] = '\0';
      local_80.bits[7] = '\0';
      local_80.bits[8] = '\0';
      local_80.bits[9] = '\0';
      local_80.bits[10] = '\0';
      local_80.bits[0xb] = '\0';
      bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
      if (bVar3) {
        local_80._0_16_ = privateCidrs();
        Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>
                  (this_00,(ArrayPtr<const_kj::CidrRange> *)&local_80);
      }
      else {
        local_80._0_8_ = "public";
        local_80.bits[4] = '\a';
        local_80.bits[5] = '\0';
        local_80.bits[6] = '\0';
        local_80.bits[7] = '\0';
        local_80.bits[8] = '\0';
        local_80.bits[9] = '\0';
        local_80.bits[10] = '\0';
        local_80.bits[0xb] = '\0';
        bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
        if (bVar3) {
          Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                    ((Fault *)&local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0xc2d,FAILED,(char *)0x0,
                     "\"don\'t deny \'public\', allow \'private\' instead\"",
                     (char (*) [45])"don\'t deny \'public\', allow \'private\' instead");
          Debug::Fault::fatal((Fault *)&local_80);
        }
        local_80.bits._4_8_ = 5;
        local_80._0_8_ = "unix";
        bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
        if (bVar3) {
          local_68->allowUnix = false;
        }
        else {
          local_80.bits._4_8_ = 0xe;
          local_80._0_8_ = "unix-abstract";
          bVar3 = ArrayPtr<const_char>::operator==(&local_58,(ArrayPtr<const_char> *)&local_80);
          if (bVar3) {
            local_68->allowAbstractUnix = false;
          }
          else {
            pattern_00.content.size_ = local_58.size_;
            pattern_00.content.ptr = local_58.ptr;
            CidrRange::CidrRange(&local_80,pattern_00);
            Vector<kj::CidrRange>::add<kj::CidrRange>(this_00,&local_80);
          }
        }
      }
    }
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

NetworkFilter::NetworkFilter(ArrayPtr<const StringPtr> allow, ArrayPtr<const StringPtr> deny,
                             NetworkFilter& next)
    : allowUnix(false), allowAbstractUnix(false), next(next) {
  for (auto rule: allow) {
    if (rule == "local") {
      allowCidrs.addAll(localCidrs());
    } else if (rule == "network") {
      // Can't be represented as a simple union of CIDRs, so we handle in shouldAllow().
      allowNetwork = true;
    } else if (rule == "private") {
      allowCidrs.addAll(privateCidrs());
      allowCidrs.addAll(localCidrs());
    } else if (rule == "public") {
      // Can't be represented as a simple union of CIDRs, so we handle in shouldAllow().
      allowPublic = true;
    } else if (rule == "unix") {
      allowUnix = true;
    } else if (rule == "unix-abstract") {
      allowAbstractUnix = true;
    } else {
      allowCidrs.add(CidrRange(rule));
    }
  }

  for (auto rule: deny) {
    if (rule == "local") {
      denyCidrs.addAll(localCidrs());
    } else if (rule == "network") {
      KJ_FAIL_REQUIRE("don't deny 'network', allow 'local' instead");
    } else if (rule == "private") {
      denyCidrs.addAll(privateCidrs());
    } else if (rule == "public") {
      // Tricky: What if we allow 'network' and deny 'public'?
      KJ_FAIL_REQUIRE("don't deny 'public', allow 'private' instead");
    } else if (rule == "unix") {
      allowUnix = false;
    } else if (rule == "unix-abstract") {
      allowAbstractUnix = false;
    } else {
      denyCidrs.add(CidrRange(rule));
    }
  }
}